

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O2

void ExchCXX::lda_screening_interface<ExchCXX::BuiltinEPC18_1>::eval_exc_polar
               (double rho_a,double rho_b,double *eps)

{
  double rho_b_00;
  double rho_a_00;
  
  if (1e-24 < rho_a + rho_b) {
    rho_a_00 = 1e-24;
    if (1e-24 <= rho_a) {
      rho_a_00 = rho_a;
    }
    rho_b_00 = 1e-24;
    if (1e-24 <= rho_b) {
      rho_b_00 = rho_b;
    }
    kernel_traits<ExchCXX::BuiltinEPC18_1>::eval_exc_polar_impl(rho_a_00,rho_b_00,eps);
    return;
  }
  *eps = 0.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar( double rho_a, double rho_b, double& eps ) {

    const double rho_s = rho_a + rho_b;
    //const double rho_z = rho_a - rho_b;

    if( rho_s <= traits::dens_tol ) {
      eps = 0.;
    } else {
      rho_a = safe_max(rho_a, traits::dens_tol);
      rho_b = safe_max(rho_b, traits::dens_tol);
      traits::eval_exc_polar_impl( rho_a, rho_b, eps );
    }

  }